

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

int xercesc_4_0::XMLUri::scanHexSequence(XMLCh *addr,XMLSize_t index,XMLSize_t end,int *counter)

{
  XMLCh theChar;
  int iVar1;
  bool bVar2;
  int iVar3;
  XMLSize_t XVar4;
  uint uVar5;
  
  if (index < end) {
    uVar5 = 0;
    XVar4 = index;
    do {
      theChar = addr[XVar4];
      iVar3 = (int)XVar4;
      if (theChar == L':') {
        if ((int)uVar5 < 1) {
          if (uVar5 == 0) {
            return iVar3;
          }
        }
        else {
          iVar1 = *counter;
          *counter = iVar1 + 1;
          if (7 < iVar1) goto LAB_00255057;
        }
        uVar5 = 0;
        if ((XVar4 + 1 < end) && (addr[XVar4 + 1] == L':')) {
          return iVar3;
        }
      }
      else {
        bVar2 = XMLString::isHex(theChar);
        if (!bVar2) {
          if (2 < uVar5 - 1) {
            return -1;
          }
          if (theChar != L'.') {
            return -1;
          }
          if (6 < *counter) {
            return -1;
          }
          if ((int)index < (int)(~uVar5 + iVar3)) {
            return ~uVar5 + iVar3;
          }
          return (int)index;
        }
        if (3 < (int)uVar5) goto LAB_00255057;
        uVar5 = uVar5 + 1;
      }
      XVar4 = XVar4 + 1;
    } while (XVar4 != end);
    iVar3 = -1;
    if (0 < (int)uVar5) {
      iVar1 = *counter;
      *counter = iVar1 + 1;
      iVar3 = -1;
      if (iVar1 < 8) {
        iVar3 = (int)end;
      }
    }
  }
  else {
LAB_00255057:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int XMLUri::scanHexSequence (const XMLCh* const addr, XMLSize_t index, XMLSize_t end, int& counter)
{
    XMLCh testChar = chNull;
    int numDigits = 0;
    XMLSize_t start = index;

    // Trying to match the following productions:
    // hexseq = hex4 *( ":" hex4)
    // hex4   = 1*4HEXDIG
    for (; index < end; ++index)
    {
      	testChar = addr[index];
      	if (testChar == chColon)
      	{
      	    // IPv6 addresses are 128-bit, so there can be at most eight sections.
      	    if (numDigits > 0 && ++counter > 8)
      	    {
      	        return -1;
      	    }
      	    // This could be '::'.
      	    if (numDigits == 0 || ((index+1 < end) && addr[index+1] == chColon))
      	    {
      	        return (int)index;
      	    }
      	    numDigits = 0;
        }
        // This might be invalid or an IPv4address. If it's potentially an IPv4address,
        // backup to just after the last valid character that matches hexseq.
        else if (!XMLString::isHex(testChar))
        {
            if (testChar == chPeriod && numDigits < 4 && numDigits > 0 && counter <= 6)
            {
                int back = (int)index - numDigits - 1;
                return (back >= (int)start) ? back : (int)start;
            }
            return -1;
        }
        // There can be at most 4 hex digits per group.
        else if (++numDigits > 4)
        {
            return -1;
        }
    }
    return (numDigits > 0 && ++counter <= 8) ? (int)end : -1;
}